

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

uint64 __thiscall
libmatroska::KaxInternalBlock::ReadInternalHead(KaxInternalBlock *this,IOCallback *input)

{
  uint uVar1;
  ushort *puVar2;
  uint64 uVar3;
  ushort uVar4;
  uint64 uVar5;
  binary Buffer [5];
  byte local_1d;
  byte local_1c;
  ushort local_1b;
  undefined1 local_19;
  
  uVar1 = (*input->_vptr_IOCallback[2])(input,&local_1d,4);
  if (uVar1 == 4) {
    this->TrackNumber = (ushort)local_1d;
    if ((char)local_1d < '\0') {
      puVar2 = (ushort *)&local_1c;
      uVar4 = local_1d & 0x7f;
      uVar5 = 4;
    }
    else {
      if (local_1d < 0x40) {
        return 4;
      }
      uVar1 = (*input->_vptr_IOCallback[2])(input,&local_19,1);
      uVar5 = (ulong)uVar1 + 4;
      uVar4 = (ushort)((*(uint *)&this->TrackNumber & 0x3f) << 8);
      this->TrackNumber = uVar4;
      puVar2 = &local_1b;
      uVar4 = local_1c | uVar4;
    }
    this->TrackNumber = uVar4;
    if (this->ParentCluster == (KaxCluster *)0x0) {
      __assert_fail("ParentCluster != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x1b6,"uint64 libmatroska::KaxInternalBlock::ReadInternalHead(IOCallback &)");
    }
    uVar3 = KaxCluster::GetBlockGlobalTimecode(this->ParentCluster,*puVar2 << 8 | *puVar2 >> 8);
    this->Timecode = uVar3;
    this->bLocalTimecodeUsed = false;
  }
  else {
    uVar5 = (uint64)uVar1;
  }
  return uVar5;
}

Assistant:

uint64 KaxInternalBlock::ReadInternalHead(IOCallback & input)
{
  binary Buffer[5], *cursor = Buffer;
  uint64 Result = input.read(cursor, 4);
  if (Result != 4)
    return Result;

  // update internal values
  TrackNumber = *cursor++;
  if ((TrackNumber & 0x80) == 0) {
    // there is extra data
    if ((TrackNumber & 0x40) == 0) {
      // We don't support track numbers that large !
      return Result;
    }
    Result += input.read(&Buffer[4], 1);
    TrackNumber = (TrackNumber & 0x3F) << 8;
    TrackNumber += *cursor++;
  } else {
    TrackNumber &= 0x7F;
  }


  big_int16 b16;
  b16.Eval(cursor);
  assert(ParentCluster != NULL);
  Timecode = ParentCluster->GetBlockGlobalTimecode(int16(b16));
  bLocalTimecodeUsed = false;
  cursor += 2;

  return Result;
}